

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

void do_section(int *ip)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  iVar1 = optype;
  if (optype == 3 && proc_ptr != (t_proc *)0x0) {
    fatal_error("No data segment in procs!");
    return;
  }
  lVar3 = (long)section;
  if (section != optype) {
    lVar2 = (long)optype;
    lVar4 = (long)bank;
    section_bank[lVar3] = bank;
    bank_glabl[lVar3][lVar4] = glablptr;
    bank_loccnt[lVar3][lVar4] = loccnt;
    bank_page[lVar3][lVar4] = page;
    section = iVar1;
    bank = section_bank[lVar2];
    page = bank_page[lVar2][bank];
    loccnt = bank_loccnt[lVar2][bank];
    glablptr = bank_glabl[lVar2][bank];
  }
  if (pass == 1) {
    loadlc(page * 0x2000 + loccnt,1);
    println();
    return;
  }
  return;
}

Assistant:

void
do_section(int *ip)
{
    (void)ip;
	if (proc_ptr) {
		if (optype == S_DATA) {
			fatal_error("No data segment in procs!");
			return;
		}
	}
	if (section != optype) {
		/* backup current section data */
		section_bank[section] = bank;
		bank_glabl[section][bank] = glablptr;
		bank_loccnt[section][bank] = loccnt;
		bank_page[section][bank] = page;

		/* change section */
		section = optype;

		/* switch to the new section */
		bank = section_bank[section];
		page = bank_page[section][bank];
		loccnt = bank_loccnt[section][bank];
		glablptr = bank_glabl[section][bank];
	}

	/* output line */
	if (pass == LAST_PASS) {
		loadlc(loccnt + (page << 13), 1);
		println();
	}
}